

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::CombinedGeometryUniformLimitCase::iterate
          (CombinedGeometryUniformLimitCase *this)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  allocator<char> local_2b9;
  CallLogWrapper gl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  ScopedLogSection section;
  StateQueryMemoryWriteGuard<int> maxUniformComponents;
  StateQueryMemoryWriteGuard<int> maxUniformBlockSize;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  StateQueryMemoryWriteGuard<int> maxUniformBlocks;
  code *local_1f8;
  GLenum local_1f0;
  ResultCollector result;
  undefined1 local_198 [384];
  
  iVar3 = (*((this->super_GeometryShaderFeartureTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198," // ERROR: ",(allocator<char> *)&local_2a0);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,(string *)local_198);
  std::__cxx11::string::~string((string *)local_198);
  gl.m_enableLog = true;
  local_198._0_8_ =
       ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,
                  "The minimum value of MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS is MAX_GEOMETRY_UNIFORM_BLOCKS x MAX_UNIFORM_BLOCK_SIZE / 4 + MAX_GEOMETRY_UNIFORM_COMPONENTS"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            (&maxUniformBlocks);
  glu::CallLogWrapper::glGetIntegerv(&gl,0x8a2c,&maxUniformBlocks.m_value);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"Got Error ",(allocator<char> *)&maxUniformBlockSize);
    local_1f8 = glu::getErrorName;
    local_1f0 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_248,&local_1f8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_228,&local_248);
    std::operator+(&local_2a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                   &local_2a0,"glGetIntegerv");
    tcu::ResultCollector::fail(&result,(string *)local_198);
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
  }
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            (&maxUniformBlockSize);
  glu::CallLogWrapper::glGetIntegerv(&gl,0x8a30,&maxUniformBlockSize.m_value);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,"Got Error ",(allocator<char> *)&maxUniformComponents);
    local_1f8 = glu::getErrorName;
    local_1f0 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_248,&local_1f8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_228,&local_248);
    std::operator+(&local_2a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                   &local_2a0,"glGetIntegerv");
    tcu::ResultCollector::fail(&result,(string *)local_198);
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
  }
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            (&maxUniformComponents);
  glu::CallLogWrapper::glGetIntegerv(&gl,0x8ddf,&maxUniformComponents.m_value);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"Got Error ",&local_2b9)
    ;
    local_1f8 = glu::getErrorName;
    local_1f0 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_248,&local_1f8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_228,&local_248);
    std::operator+(&local_2a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                   &local_2a0,"glGetIntegerv");
    tcu::ResultCollector::fail(&result,(string *)local_198);
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
  }
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&maxUniformBlocks,&result);
  if (bVar2) {
    bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                      (&maxUniformBlockSize,&result);
    if (bVar2) {
      bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                        (&maxUniformComponents,&result);
      if (bVar2) {
        iVar3 = (maxUniformBlockSize.m_value * maxUniformBlocks.m_value) / 4 +
                maxUniformComponents.m_value;
        deqp::gls::StateQueryUtil::verifyStateIntegerMin(&result,&gl,0x8a32,iVar3,QUERY_INTEGER);
        pTVar1 = ((this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                  super_TestNode.m_testCtx)->m_log;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_198,"Types",(allocator<char> *)&local_228);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a0,"Alternative queries",(allocator<char> *)&local_248);
        tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,(string *)local_198,&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)local_198);
        deqp::gls::StateQueryUtil::verifyStateIntegerMin(&result,&gl,0x8a32,iVar3,QUERY_BOOLEAN);
        deqp::gls::StateQueryUtil::verifyStateIntegerMin(&result,&gl,0x8a32,iVar3,QUERY_INTEGER64);
        deqp::gls::StateQueryUtil::verifyStateIntegerMin(&result,&gl,0x8a32,iVar3,QUERY_FLOAT);
        tcu::ScopedLogSection::~ScopedLogSection(&section);
      }
    }
  }
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_GeometryShaderFeartureTestCase).super_TestCase.super_TestCase.
                     super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

CombinedGeometryUniformLimitCase::IterateResult CombinedGeometryUniformLimitCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "The minimum value of MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS is MAX_GEOMETRY_UNIFORM_BLOCKS x MAX_UNIFORM_BLOCK_SIZE / 4 + MAX_GEOMETRY_UNIFORM_COMPONENTS"
						<< tcu::TestLog::EndMessage;

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlocks;
	gl.glGetIntegerv(GL_MAX_GEOMETRY_UNIFORM_BLOCKS, &maxUniformBlocks);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformBlockSize;
	gl.glGetIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &maxUniformBlockSize);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	StateQueryMemoryWriteGuard<glw::GLint> maxUniformComponents;
	gl.glGetIntegerv(GL_MAX_GEOMETRY_UNIFORM_COMPONENTS, &maxUniformComponents);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	if (maxUniformBlocks.verifyValidity(result) && maxUniformBlockSize.verifyValidity(result) && maxUniformComponents.verifyValidity(result))
	{
		const int limit = ((int)maxUniformBlocks) * ((int)maxUniformBlockSize) / 4 + (int)maxUniformComponents;
		verifyStateIntegerMin(result, gl, GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS, limit, QUERY_INTEGER);

		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Types", "Alternative queries");
			verifyStateIntegerMin(result, gl, GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS, limit, QUERY_BOOLEAN);
			verifyStateIntegerMin(result, gl, GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS, limit, QUERY_INTEGER64);
			verifyStateIntegerMin(result, gl, GL_MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS, limit, QUERY_FLOAT);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}